

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall Assimp::LWOImporter::LoadLWO2Envelope(LWOImporter *this,uint length)

{
  pointer *ppKVar1;
  byte bVar2;
  byte bVar3;
  pointer pEVar4;
  byte *pbVar5;
  pointer pKVar6;
  iterator __position;
  uint *puVar7;
  Logger *this_00;
  runtime_error *prVar8;
  ushort uVar9;
  byte *pbVar10;
  uint uVar11;
  long lVar12;
  char *message;
  uint *puVar13;
  uint *puVar14;
  uint *puVar15;
  Envelope local_70;
  vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *local_38;
  
  if (length < 4) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70._0_8_ = &local_70.keys;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"LWO: ENVL chunk is too small","");
    std::runtime_error::runtime_error(prVar8,(string *)&local_70);
    *(undefined ***)prVar8 = &PTR__runtime_error_00896c98;
    __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar15 = (uint *)(this->mFileBuffer + length);
  local_70._0_8_ = (vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)0x1000000000;
  local_70.pre = PrePostBehaviour_Constant;
  local_70.post = PrePostBehaviour_Constant;
  local_70.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.old_first = 0;
  local_70.old_last = 0;
  std::vector<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::
  emplace_back<Assimp::LWO::Envelope>(&this->mEnvelopes,&local_70);
  if (local_70.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.keys.
                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pEVar4 = (this->mEnvelopes).
           super__Vector_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pbVar5 = this->mFileBuffer;
  bVar2 = *pbVar5;
  pbVar10 = pbVar5 + 1;
  this->mFileBuffer = pbVar10;
  if (bVar2 == 0xff) {
    bVar2 = pbVar5[1];
    this->mFileBuffer = pbVar5 + 2;
    bVar3 = pbVar5[2];
    pbVar10 = pbVar5 + 3;
    this->mFileBuffer = pbVar10;
    uVar11 = (uint)bVar3 << 8 | (uint)bVar2 << 0x10;
    lVar12 = 4;
  }
  else {
    uVar11 = (uint)bVar2 << 8;
    lVar12 = 2;
  }
  bVar2 = *pbVar10;
  this->mFileBuffer = pbVar5 + lVar12;
  pEVar4[-1].index = bVar2 | uVar11;
  if (this->mIsLXOB == true) {
    this->mFileBuffer =
         (uint8_t *)((long)this->mFileBuffer + (ulong)(*(int *)this->mFileBuffer == 0) * 4);
  }
  puVar7 = (uint *)((long)this->mFileBuffer + 6);
  if (puVar7 < puVar15) {
    local_38 = &pEVar4[-1].keys;
    puVar13 = (uint *)this->mFileBuffer;
    do {
      uVar11 = *puVar13;
      this->mFileBuffer = (uint8_t *)(puVar13 + 1);
      uVar9 = (ushort)puVar13[1] << 8 | (ushort)puVar13[1] >> 8;
      this->mFileBuffer = (uint8_t *)puVar7;
      puVar14 = (uint *)((ulong)uVar9 + (long)puVar7);
      if (puVar15 < puVar14) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_70._0_8_ = &local_70.keys;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"LWO2: Invalid envelope chunk length","");
        std::runtime_error::runtime_error(prVar8,(string *)&local_70);
        *(undefined ***)prVar8 = &PTR__runtime_error_00896c98;
        __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
      if ((int)uVar11 < 0x50524520) {
        if (uVar11 == 0x4b455920) {
          if (uVar9 < 8) {
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_70._0_8_ = &local_70.keys;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,"LWO: KEY chunk is too small","");
            std::runtime_error::runtime_error(prVar8,(string *)&local_70);
            *(undefined ***)prVar8 = &PTR__runtime_error_00896c98;
            __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          local_70._0_8_ = (vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)0x0;
          local_70.pre = PrePostBehaviour_Reset;
          local_70.post = PrePostBehaviour_Constant;
          local_70.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_70.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_70.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)local_70.keys.
                                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffff00000000);
          __position._M_current =
               pEVar4[-1].keys.
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              pEVar4[-1].keys.
              super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::
            _M_realloc_insert<Assimp::LWO::Key>(local_38,__position,(Key *)&local_70);
          }
          else {
            *(pointer *)((__position._M_current)->params + 4) =
                 local_70.keys.
                 super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            (__position._M_current)->params[0] = 0.0;
            (__position._M_current)->params[1] = 0.0;
            (__position._M_current)->params[2] = 0.0;
            (__position._M_current)->params[3] = 0.0;
            (__position._M_current)->time = 0.0;
            (__position._M_current)->value = 0.0;
            (__position._M_current)->inter = IT_LINE;
            ppKVar1 = &pEVar4[-1].keys.
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppKVar1 = *ppKVar1 + 1;
          }
          pKVar6 = pEVar4[-1].keys.
                   super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar11 = *(uint *)this->mFileBuffer;
          this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 4);
          pKVar6[-1].time =
               (double)(float)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                              uVar11 << 0x18);
          uVar11 = *(uint *)this->mFileBuffer;
          this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 4);
          pKVar6[-1].value =
               (float)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                      uVar11 << 0x18);
        }
        else {
          if (uVar11 != 0x504f5354) {
LAB_0044319a:
            this_00 = DefaultLogger::get();
            message = "LWO2: Encountered unknown ENVL subchunk";
            goto LAB_004431a5;
          }
          if (uVar9 < 2) {
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_70._0_8_ = &local_70.keys;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,"LWO: POST chunk is too small","");
            std::runtime_error::runtime_error(prVar8,(string *)&local_70);
            *(undefined ***)prVar8 = &PTR__runtime_error_00896c98;
            __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar11 = *puVar7;
          this->mFileBuffer = (uint8_t *)(puVar13 + 2);
          pEVar4[-1].post = (uint)(ushort)((ushort)uVar11 << 8 | (ushort)uVar11 >> 8);
        }
      }
      else if (uVar11 == 0x50524520) {
        if (uVar9 < 2) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_70._0_8_ = &local_70.keys;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"LWO: PRE chunk is too small","");
          std::runtime_error::runtime_error(prVar8,(string *)&local_70);
          *(undefined ***)prVar8 = &PTR__runtime_error_00896c98;
          __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar11 = *puVar7;
        this->mFileBuffer = (uint8_t *)(puVar13 + 2);
        pEVar4[-1].pre = (uint)(ushort)((ushort)uVar11 << 8 | (ushort)uVar11 >> 8);
      }
      else if (uVar11 == 0x5350414e) {
        if (uVar9 < 4) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_70._0_8_ = &local_70.keys;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"LWO: SPAN chunk is too small","");
          std::runtime_error::runtime_error(prVar8,(string *)&local_70);
          *(undefined ***)prVar8 = &PTR__runtime_error_00896c98;
          __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        pKVar6 = pEVar4[-1].keys.
                 super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((ulong)(((long)pKVar6 -
                     (long)pEVar4[-1].keys.
                           super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2
           ) {
          this_00 = DefaultLogger::get();
          message = "LWO2: Unexpected SPAN chunk";
LAB_004431a5:
          Logger::warn(this_00,message);
        }
        else {
          uVar11 = *puVar7;
          this->mFileBuffer = (uint8_t *)((long)puVar13 + 10);
          uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18;
          if ((int)uVar11 < 0x4c494e45) {
            if (uVar11 == 0x42455a32) {
              pKVar6[-1].inter = IT_BEZ2;
            }
            else if (uVar11 == 0x42455a49) {
              pKVar6[-1].inter = IT_BEZI;
            }
            else {
              if (uVar11 != 0x4845524d) {
LAB_00443288:
                this_00 = DefaultLogger::get();
                message = "LWO2: Unknown interval interpolation mode";
                goto LAB_004431a5;
              }
              pKVar6[-1].inter = IT_HERM;
            }
          }
          else if (uVar11 == 0x4c494e45) {
            pKVar6[-1].inter = IT_LINE;
          }
          else if (uVar11 == 0x54434220) {
            pKVar6[-1].inter = IT_TCB;
          }
          else {
            if (uVar11 != 0x53544550) goto LAB_00443288;
            pKVar6[-1].inter = IT_STEP;
          }
        }
      }
      else {
        if (uVar11 != 0x54595045) goto LAB_0044319a;
        if (uVar9 < 2) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_70._0_8_ = &local_70.keys;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"LWO: TYPE chunk is too small","");
          std::runtime_error::runtime_error(prVar8,(string *)&local_70);
          *(undefined ***)prVar8 = &PTR__runtime_error_00896c98;
          __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        this->mFileBuffer = (uint8_t *)((long)puVar13 + 7);
        pEVar4[-1].type = (uint)*(byte *)((long)puVar13 + 7);
        this->mFileBuffer = this->mFileBuffer + 1;
      }
      this->mFileBuffer = (uint8_t *)puVar14;
      puVar7 = (uint *)((long)puVar14 + 6);
      puVar13 = puVar14;
    } while (puVar7 < puVar15);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2Envelope(unsigned int length)
{
    LE_NCONST uint8_t* const end = mFileBuffer + length;
    AI_LWO_VALIDATE_CHUNK_LENGTH(length,ENVL,4);

    mEnvelopes.push_back(LWO::Envelope());
    LWO::Envelope& envelope = mEnvelopes.back();

    // Get the index of the envelope
    envelope.index = ReadVSizedIntLWO2(mFileBuffer);

    // It looks like there might be an extra U4 right after the index,
    // at least in modo (LXOB) files: we'll ignore it if it's zero,
    // otherwise it represents the start of a subchunk, so we backtrack.
    if (mIsLXOB)
    {
        uint32_t extra = GetU4();
        if (extra)
        {
            mFileBuffer -= 4;
        }
    }

    // ... and read all subchunks
    while (true)
    {
        if (mFileBuffer + 6 >= end)break;
        LE_NCONST IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid envelope chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
            // Type & representation of the envelope
        case AI_LWO_TYPE:
            AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TYPE,2);
            mFileBuffer++; // skip user format

            // Determine type of envelope
            envelope.type  = (LWO::EnvelopeType)*mFileBuffer;
            ++mFileBuffer;
            break;

            // precondition
        case AI_LWO_PRE:
            AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,PRE,2);
            envelope.pre = (LWO::PrePostBehaviour)GetU2();
            break;

            // postcondition
        case AI_LWO_POST:
            AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,POST,2);
            envelope.post = (LWO::PrePostBehaviour)GetU2();
            break;

            // keyframe
        case AI_LWO_KEY:
            {
            AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,KEY,8);

            envelope.keys.push_back(LWO::Key());
            LWO::Key& key = envelope.keys.back();

            key.time = GetF4();
            key.value = GetF4();
            break;
            }

            // interval interpolation
        case AI_LWO_SPAN:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SPAN,4);
                if (envelope.keys.size()<2)
                    ASSIMP_LOG_WARN("LWO2: Unexpected SPAN chunk");
                else {
                    LWO::Key& key = envelope.keys.back();
                    switch (GetU4())
                    {
                        case AI_LWO_STEP:
                            key.inter = LWO::IT_STEP;break;
                        case AI_LWO_LINE:
                            key.inter = LWO::IT_LINE;break;
                        case AI_LWO_TCB:
                            key.inter = LWO::IT_TCB;break;
                        case AI_LWO_HERM:
                            key.inter = LWO::IT_HERM;break;
                        case AI_LWO_BEZI:
                            key.inter = LWO::IT_BEZI;break;
                        case AI_LWO_BEZ2:
                            key.inter = LWO::IT_BEZ2;break;
                        default:
                            ASSIMP_LOG_WARN("LWO2: Unknown interval interpolation mode");
                    };

                    // todo ... read params
                }
                break;
            }

        default:
            ASSIMP_LOG_WARN("LWO2: Encountered unknown ENVL subchunk");
            break;
        }
        // regardless how much we did actually read, go to the next chunk
        mFileBuffer = next;
    }
}